

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wifi_impl.cpp
# Opt level: O1

Element __thiscall ui::anon_unknown_0::WiFiImpl::Render(WiFiImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  mutex_type *pmVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  int __fd;
  int iVar5;
  long lVar6;
  int *piVar7;
  long *plVar8;
  char *pcVar9;
  element_type *peVar10;
  size_type *psVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  long lVar13;
  long in_RSI;
  undefined8 uVar14;
  WiFiImpl *this_00;
  _Alloc_hider _Var15;
  Element EVar16;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l_00;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l_01;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l_02;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l_03;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l_04;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l_05;
  iwreq wlan_ioctl_req;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> current_network;
  char active_wlan_id [33];
  undefined8 uStack_258;
  undefined1 local_250 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  undefined8 uStack_230;
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  string local_208;
  shared_ptr<ftxui::Node> local_1e8;
  undefined1 local_1d8 [24];
  pointer local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Any_data local_1a8;
  undefined1 local_198 [8];
  code *pcStack_190;
  _Any_data local_188;
  code *local_178;
  code *pcStack_170;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_160;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_148;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_130;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_118;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_100;
  unique_lock<std::mutex> local_e8;
  ftxui local_d8 [16];
  ftxui local_c8 [16];
  ftxui local_b8 [16];
  Element local_a8;
  Decorator local_98;
  string local_70;
  string local_50;
  
  if (*(char *)(in_RSI + 0x249) == '\x01') {
    pmVar2 = *(mutex_type **)(in_RSI + 0x270);
    local_e8._M_owns = false;
    local_e8._M_device = pmVar2;
    std::unique_lock<std::mutex>::lock(&local_e8);
    local_e8._M_owns = true;
    lVar13 = *(long *)((long)&pmVar2[2].super___mutex_base._M_mutex + 8);
    lVar6 = *(long *)((long)&pmVar2[1].super___mutex_base._M_mutex + 0x10);
    std::unique_lock<std::mutex>::~unique_lock(&local_e8);
    if (lVar13 != lVar6) {
      do {
        ftxui::
        ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::Receive(*(ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    **)(in_RSI + 0x270),
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(in_RSI + 0x230));
        pmVar2 = *(mutex_type **)(in_RSI + 0x270);
        local_e8._M_owns = false;
        local_e8._M_device = pmVar2;
        std::unique_lock<std::mutex>::lock(&local_e8);
        local_e8._M_owns = true;
        lVar13 = *(long *)((long)&pmVar2[2].super___mutex_base._M_mutex + 8);
        lVar6 = *(long *)((long)&pmVar2[1].super___mutex_base._M_mutex + 0x10);
        std::unique_lock<std::mutex>::~unique_lock(&local_e8);
      } while (lVar13 != lVar6);
    }
    if (*(int *)(in_RSI + 0x2c) == 1) {
      local_1d8._16_8_ = &local_1b8;
      local_1b8._M_allocated_capacity = 0x206b726f7774654e;
      local_1c0 = (pointer)0xa;
      local_1b8._8_3_ = 0x203a;
      ftxui::text((ftxui *)&local_1e8,(string *)(local_1d8 + 0x10));
      lVar6 = (long)*(int *)(in_RSI + 0x28) * 0x20;
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      lVar13 = *(long *)(*(long *)(in_RSI + 0x230) + lVar6);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,lVar13,
                 *(long *)(*(long *)(in_RSI + 0x230) + 8 + lVar6) + lVar13);
      ftxui::text((ftxui *)local_1d8,&local_208);
      __l._M_len = 2;
      __l._M_array = &local_1e8;
      std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
      vector(&local_130,__l,(allocator_type *)((long)&uStack_258 + 7));
      ftxui::hbox((ftxui *)local_250,&local_130);
      local_1a8._M_unused._M_object = local_198;
      local_198 = (undefined1  [8])0x64726f7773736150;
      local_1a8._8_8_ = 10;
      pcStack_190 = (code *)CONCAT53(pcStack_190._3_5_,0x203a);
      EVar16 = ftxui::text((ftxui *)local_188._M_pod_data,(string *)&local_1a8);
      (**(code **)(**(long **)(in_RSI + 0x1e0) + 0x10))
                (&local_178,*(long **)(in_RSI + 0x1e0),
                 EVar16.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._M_pi);
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&local_188;
      std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
      vector(&local_148,__l_00,(allocator_type *)((long)&uStack_230 + 7));
      ftxui::hbox((ftxui *)(local_250 + 0x10),&local_148);
      __l_01._M_len = 2;
      __l_01._M_array = (iterator)local_250;
      std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
      vector(&local_118,__l_01,(allocator_type *)((long)&uStack_230 + 6));
      EVar16 = ftxui::vbox((ftxui *)local_228,&local_118);
      (**(code **)(**(long **)(in_RSI + 0x1f0) + 0x10))
                (&local_e8,*(long **)(in_RSI + 0x1f0),
                 EVar16.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._M_pi);
      (**(code **)(**(long **)(in_RSI + 0x200) + 0x10))(local_d8);
      (**(code **)(**(long **)(in_RSI + 0x210) + 0x10))(local_c8);
      __l_02._M_len = 3;
      __l_02._M_array = (iterator)&local_e8;
      std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
      vector(&local_160,__l_02,(allocator_type *)((long)&uStack_230 + 5));
      ftxui::hbox((ftxui *)(local_228 + 0x10),&local_160);
      __l_03._M_len = 2;
      __l_03._M_array = (iterator)local_228;
      std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
      vector(&local_100,__l_03,(allocator_type *)((long)&uStack_230 + 4));
      ftxui::vbox((ftxui *)&local_a8,&local_100);
      local_98.super__Function_base._M_functor._8_8_ = 0;
      local_98.super__Function_base._M_functor._M_unused._M_object = ftxui::nothing;
      local_98._M_invoker =
           std::
           _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
           ::_M_invoke;
      local_98.super__Function_base._M_manager =
           std::
           _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
           ::_M_manager;
      ftxui::operator|((ftxui *)this,&local_a8,&local_98);
      if (local_98.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_98.super__Function_base._M_manager)
                  ((_Any_data *)&local_98,(_Any_data *)&local_98,__destroy_functor);
      }
      if (local_a8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
      ~vector(&local_100);
      lVar13 = 0x20;
      do {
        if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_230 + lVar13) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_230 + lVar13))
          ;
        }
        lVar13 = lVar13 + -0x10;
      } while (lVar13 != 0);
      std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
      ~vector(&local_160);
      lVar13 = 0x30;
      do {
        p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&local_100.
                          super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar13);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        lVar13 = lVar13 + -0x10;
      } while (lVar13 != 0);
      std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
      ~vector(&local_118);
      lVar13 = 0x20;
      do {
        if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_258 + lVar13) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_258 + lVar13))
          ;
        }
        lVar13 = lVar13 + -0x10;
      } while (lVar13 != 0);
      std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
      ~vector(&local_148);
      lVar13 = 0x20;
      do {
        if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&pcStack_190 + lVar13) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&pcStack_190 + lVar13)
                    );
        }
        lVar13 = lVar13 + -0x10;
      } while (lVar13 != 0);
      if ((undefined1 *)local_1a8._M_unused._0_8_ != local_198) {
        operator_delete(local_1a8._M_unused._M_object,(ulong)((long)local_198 + 1));
      }
      std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
      ~vector(&local_130);
      lVar13 = 0x20;
      _Var12._M_pi = extraout_RDX;
      do {
        p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&local_208.field_2 + lVar13 + 8);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          _Var12._M_pi = extraout_RDX_00;
        }
        lVar13 = lVar13 + -0x10;
      } while (lVar13 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        uVar14 = (unique_lock<std::mutex> *)
                 CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                          local_208.field_2._M_allocated_capacity._0_4_);
        _Var15._M_p = local_208._M_dataplus._M_p;
        goto LAB_00130431;
      }
    }
    else {
      if (*(int *)(in_RSI + 0x2c) != 0) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Not implemented","");
        EVar16 = ftxui::text((ftxui *)this,&local_50);
        _Var12 = EVar16.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        local_70.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
        _Var15._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0013045e;
        goto LAB_00130456;
      }
      pcVar9 = "Scan network";
      this_00 = (WiFiImpl *)(in_RSI + 0x250);
      if (*(char *)(in_RSI + 0x248) != '\0') {
        pcVar9 = "Scan network (Status: scanning...)";
      }
      std::__cxx11::string::_M_replace((ulong)this_00,0,*(char **)(in_RSI + 600),(ulong)pcVar9);
      bVar4 = WifiStatus(this_00);
      local_218._M_allocated_capacity = 0;
      local_228._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_218._8_8_ = 0x21;
      local_228._0_8_ = (element_type *)0x306e616c77;
      __fd = socket(2,2,0);
      if (__fd == -1) {
        local_1e8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_1d8;
        local_1d8._0_4_ = 0x6f727245;
        local_1e8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7;
        local_1d8._4_4_ = 0x203a72;
        piVar7 = __errno_location();
        strerror(*piVar7);
        plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                                   ((ulong)&local_1e8,
                                    (ulong)local_1e8.
                                           super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi,0,'\x01');
        local_250._0_8_ = local_250 + 0x10;
        peVar10 = (element_type *)(plVar8 + 2);
        if ((element_type *)*plVar8 == peVar10) {
          local_240._M_allocated_capacity = (size_type)peVar10->_vptr_Node;
          local_240._8_8_ = plVar8[3];
        }
        else {
          local_240._M_allocated_capacity = (size_type)peVar10->_vptr_Node;
          local_250._0_8_ = (element_type *)*plVar8;
        }
        local_250._8_8_ = plVar8[1];
        *plVar8 = (long)peVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::operator=
                                   ((string *)(in_RSI + 0x2c0),(string *)local_250);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_208,*plVar8,plVar8[1] + *plVar8);
LAB_00130043:
        if ((element_type *)local_250._0_8_ != (element_type *)(local_250 + 0x10)) {
          operator_delete((void *)local_250._0_8_,local_240._M_allocated_capacity + 1);
        }
        if (local_1e8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)local_1d8) {
          operator_delete(local_1e8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + 1);
        }
      }
      else {
        local_218._M_allocated_capacity = (size_type)&local_e8;
        iVar5 = ioctl(__fd,0x8b1b);
        if (iVar5 == -1) {
          local_1e8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_1d8;
          local_1d8._0_4_ = 0x6f727245;
          local_1e8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7;
          local_1d8._4_4_ = 0x203a72;
          piVar7 = __errno_location();
          strerror(*piVar7);
          plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                                     ((ulong)&local_1e8,
                                      (ulong)local_1e8.
                                             super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi,0,'\x01');
          local_250._0_8_ = local_250 + 0x10;
          peVar10 = (element_type *)(plVar8 + 2);
          if ((element_type *)*plVar8 == peVar10) {
            local_240._M_allocated_capacity = (size_type)peVar10->_vptr_Node;
            local_240._8_8_ = plVar8[3];
          }
          else {
            local_240._M_allocated_capacity = (size_type)peVar10->_vptr_Node;
            local_250._0_8_ = (element_type *)*plVar8;
          }
          local_250._8_8_ = plVar8[1];
          *plVar8 = (long)peVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::operator=
                                     ((string *)(in_RSI + 0x2c0),(string *)local_250);
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,*plVar8,plVar8[1] + *plVar8);
          goto LAB_00130043;
        }
        close(__fd);
        uVar14 = local_218._M_allocated_capacity;
        plVar8 = (long *)(in_RSI + 0x2c0);
        pcVar9 = *(char **)(in_RSI + 0x2c8);
        strlen((char *)local_218._M_allocated_capacity);
        std::__cxx11::string::_M_replace((ulong)plVar8,0,pcVar9,uVar14);
        lVar13 = *(long *)(in_RSI + 0x2c8);
        if (lVar13 == 0) {
          plVar8 = (long *)std::__cxx11::string::_M_replace((ulong)plVar8,0,(char *)0x0,0x1596e9);
          lVar6 = *plVar8;
          lVar13 = plVar8[1];
        }
        else {
          lVar6 = *plVar8;
        }
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_208,lVar6,lVar13 + lVar6);
      }
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,0x1596c7);
      local_1d8._16_8_ = &local_1b8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_1b8._M_allocated_capacity = *psVar11;
        local_1b8._8_8_ = plVar8[3];
      }
      else {
        local_1b8._M_allocated_capacity = *psVar11;
        local_1d8._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar8;
      }
      local_1c0 = (pointer)plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      pcVar9 = "WiFi Status : Disabled";
      if (bVar4) {
        pcVar9 = "WiFi Status : Enabled";
      }
      *(undefined1 *)(plVar8 + 2) = 0;
      paVar1 = &local_208.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,
                        CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                                 local_208.field_2._M_allocated_capacity._0_4_) + 1);
      }
      local_228._0_8_ = local_228 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_228,pcVar9,pcVar9 + (0x16 - (ulong)bVar4));
      ftxui::text((ftxui *)&local_e8,(string *)local_228);
      local_250._0_8_ = local_250 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_250,local_1d8._16_8_,
                 (char *)(local_1d8._16_8_ +
                         (long)&local_1c0->
                                super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>));
      EVar16 = ftxui::text(local_d8,(string *)local_250);
      (**(code **)(**(long **)(in_RSI + 0x220) + 0x10))
                (&local_1e8,*(long **)(in_RSI + 0x220),
                 EVar16.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._M_pi);
      (**(code **)(**(long **)(in_RSI + 0xf0) + 0x10))(local_1d8);
      __l_04._M_len = 2;
      __l_04._M_array = &local_1e8;
      std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
      vector(&local_100,__l_04,(allocator_type *)&local_a8);
      ftxui::hbox(local_c8,&local_100);
      local_208.field_2._M_allocated_capacity._0_4_ = 0x7774654e;
      local_208._M_string_length = 7;
      local_208.field_2._M_allocated_capacity._4_4_ = 0x6b726f;
      local_208._M_dataplus._M_p = (pointer)paVar1;
      EVar16 = ftxui::text((ftxui *)&local_130,&local_208);
      (**(code **)(**(long **)(in_RSI + 0x100) + 0x10))
                (&local_160,*(long **)(in_RSI + 0x100),
                 EVar16.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._M_pi);
      local_188._8_8_ = 0;
      local_188._M_unused._M_object = ftxui::yframe;
      pcStack_170 = std::
                    _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                    ::_M_invoke;
      local_178 = std::
                  _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                  ::_M_manager;
      ftxui::operator|((ftxui *)&local_148,(Element *)&local_160,(Decorator *)&local_188);
      ftxui::window(local_b8,(Element *)&local_130,(Element *)&local_148);
      __l_05._M_len = 4;
      __l_05._M_array = (iterator)&local_e8;
      std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
      vector((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *
             )&local_98,__l_05,(allocator_type *)((long)&uStack_258 + 7));
      ftxui::vbox((ftxui *)&local_118,(Elements *)&local_98);
      local_1a8._8_8_ = 0;
      local_1a8._M_unused._M_object = ftxui::flex;
      pcStack_190 = std::
                    _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                    ::_M_invoke;
      local_198 = (undefined1  [8])
                  std::
                  _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                  ::_M_manager;
      ftxui::operator|((ftxui *)this,(Element *)&local_118,(Decorator *)&local_1a8);
      if (local_198 != (undefined1  [8])0x0) {
        (*(code *)local_198)(&local_1a8,&local_1a8,3);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_118.
          super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_118.
                   super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
      ~vector((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
               *)&local_98);
      lVar13 = 0x40;
      do {
        p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&local_100.
                          super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar13);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        lVar13 = lVar13 + -0x10;
      } while (lVar13 != 0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_148.
          super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_148.
                   super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_178 != (code *)0x0) {
        (*local_178)(&local_188,&local_188,__destroy_functor);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_160.
          super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_160.
                   super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_130.
          super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_130.
                   super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,
                        CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                                 local_208.field_2._M_allocated_capacity._0_4_) + 1);
      }
      std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
      ~vector(&local_100);
      lVar13 = 0x20;
      _Var12._M_pi = extraout_RDX_01;
      do {
        p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&local_208.field_2 + lVar13 + 8);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          _Var12._M_pi = extraout_RDX_02;
        }
        lVar13 = lVar13 + -0x10;
      } while (lVar13 != 0);
      if ((element_type *)local_250._0_8_ != (element_type *)(local_250 + 0x10)) {
        operator_delete((void *)local_250._0_8_,local_240._M_allocated_capacity + 1);
        _Var12._M_pi = extraout_RDX_03;
      }
      uVar14 = local_218._M_allocated_capacity;
      _Var15._M_p = (pointer)local_228._0_8_;
      if ((element_type *)local_228._0_8_ != (element_type *)(local_228 + 0x10)) {
LAB_00130431:
        operator_delete(_Var15._M_p,
                        (ulong)((long)&((unique_lock<std::mutex> *)uVar14)->_M_device + 1));
        _Var12._M_pi = extraout_RDX_04;
      }
    }
    local_70.field_2._M_allocated_capacity = local_1b8._M_allocated_capacity;
    _Var15._M_p = (pointer)local_1d8._16_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._16_8_ == &local_1b8) goto LAB_0013045e;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Feature not supported","");
    EVar16 = ftxui::text((ftxui *)this,&local_70);
    _Var12 = EVar16.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    _Var15._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0013045e;
  }
LAB_00130456:
  operator_delete(_Var15._M_p,local_70.field_2._M_allocated_capacity + 1);
  _Var12._M_pi = extraout_RDX_05;
LAB_0013045e:
  EVar16.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  EVar16.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar16.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    if (wifiCompatiblity) {
      while (wifi_list_receiver_->HasPending())
        wifi_list_receiver_->Receive(&wifi_list_);

      if (activity == ActivityMain)
        return RenderMain();

      if (activity == ActivityConnect)
        return RenderConnect();

      return text("Not implemented");
    } else {
      return text("Feature not supported");
    }
  }